

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

void __thiscall Sampler::Sampler(Sampler *this,int amount,Mat *image)

{
  time_t tVar1;
  Mat *image_local;
  int amount_local;
  Sampler *this_local;
  
  this->_Amount = amount;
  cv::Mat::Mat(&this->_Image,image);
  memset(&this->_SampleMap_xy,0,0x30);
  std::
  map<std::pair<int,_int>,_cv::Vec<unsigned_char,_4>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_cv::Vec<unsigned_char,_4>_>_>_>
  ::map(&this->_SampleMap_xy);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this->_Beamer_Resolution_x = 0x780;
  this->_Beamer_Resolution_y = 0x438;
  this->_X = *(int *)&this->field_0x14;
  this->_Y = *(int *)&this->field_0x10;
  return;
}

Assistant:

Sampler(int amount, Mat const& image):
      _Amount(amount),
      _Image(image),
  //    _SampleMap_x(),
      _SampleMap_xy()
      //_Out(generalout),
  //    _Overlapmap(brigthnesmap)
      {
        srand(time(NULL));  //SEED
        _Beamer_Resolution_x = 1920;
        _Beamer_Resolution_y = 1080;
        _X=_Image.cols;
        _Y=_Image.rows;
      }